

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::reallocate
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Name *pNVar3;
  undefined8 uVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  
  pNVar3 = this->data;
  ArenaVector<wasm::Name>::allocate((ArenaVector<wasm::Name> *)this,size);
  lVar5 = 0;
  for (uVar6 = 0; uVar6 < this->usedElements; uVar6 = uVar6 + 1) {
    puVar1 = (undefined8 *)((long)&(pNVar3->super_IString).str._M_len + lVar5);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)((long)&(this->data->super_IString).str._M_len + lVar5);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    lVar5 = lVar5 + 0x10;
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }